

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall compiler::EmissionContext::Declare(EmissionContext *this,string *var)

{
  reference this_00;
  undefined1 local_38 [8];
  VariableDeclaration vd;
  
  local_38 = (undefined1  [8])&vd.value._M_string_length;
  vd.value._M_dataplus._M_p = (pointer)0x0;
  vd.value._M_string_length._0_1_ = 0;
  std::__cxx11::string::_M_assign((string *)local_38);
  vd.value.field_2._M_local_buf[8] = '\0';
  if (this->firstFreeVariablesIndex <
      (ulong)(((long)(this->variables).
                     super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->variables).
                    super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    this_00 = std::
              vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
              ::at(&this->variables,this->firstFreeVariablesIndex);
    VariableDeclaration::operator=(this_00,(VariableDeclaration *)local_38);
  }
  else {
    std::vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::
    push_back(&this->variables,(value_type *)local_38);
  }
  this->firstFreeVariablesIndex = this->firstFreeVariablesIndex + 1;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Declare(const std::string & var) {
    VariableDeclaration vd;
    vd.value = var;
    vd.isFullyBound = false;

    if (this->firstFreeVariablesIndex < this->variables.size()) {
      this->variables.at(this->firstFreeVariablesIndex) = vd;
    } else {
      this->variables.push_back(vd);
    }
    this->firstFreeVariablesIndex++;
  }